

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzadmchunk.h
# Opt level: O1

void __thiscall
TPZAdmChunkVector<TPZGeoNode,_10>::Resize(TPZAdmChunkVector<TPZGeoNode,_10> *this,int newsize)

{
  int64_t iVar1;
  ulong uVar2;
  int *piVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  TPZManVector<int,_10> local_70;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZAdmChunkVector::Resize. Bad parameter newsize.",0x31);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  TPZChunkVector<TPZGeoNode,_10>::Resize
            (&this->super_TPZChunkVector<TPZGeoNode,_10>,(ulong)(uint)newsize);
  iVar1 = (this->fNFree).super_TPZVec<int>.fNElements;
  iVar6 = (int)(this->super_TPZChunkVector<TPZGeoNode,_10>).fVec.super_TPZVec<TPZGeoNode_*>.
               fNElements;
  TPZManVector<int,_10>::Resize(&this->fNFree,(long)iVar6);
  uVar4 = (uint)iVar1;
  if ((int)uVar4 < iVar6) {
    memset((this->fNFree).super_TPZVec<int>.fStore + (int)uVar4,0,(ulong)(iVar6 + ~uVar4) * 4 + 4);
  }
  else {
    local_70.super_TPZVec<int>.fStore = (int *)0x0;
    local_70.super_TPZVec<int>.fNElements = 0;
    local_70.super_TPZVec<int>.fNAlloc = 0;
    local_70.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01841b20;
    uVar2 = (this->fFree).super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements;
    if ((long)uVar2 < 0xb) {
      local_70.super_TPZVec<int>.fStore = local_70.fExtAlloc;
      local_70.super_TPZVec<int>.fNAlloc = 0;
    }
    else {
      local_70.super_TPZVec<int>.fStore =
           (int *)operator_new__(-(ulong)(uVar2 >> 0x3e != 0) | uVar2 * 4);
      local_70.super_TPZVec<int>.fNAlloc = uVar2;
    }
    if (0 < (long)uVar2) {
      piVar3 = (this->fFree).super_TPZManVector<int,_10>.super_TPZVec<int>.fStore;
      uVar5 = 0;
      do {
        local_70.super_TPZVec<int>.fStore[uVar5] = piVar3[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar2 != uVar5);
    }
    local_70.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01841ed8;
    local_70.super_TPZVec<int>.fNElements = uVar2;
    TPZManVector<int,_10>::Resize(&local_70,0);
    if (0 < (this->fFree).super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements) {
      do {
        uVar4 = TPZStack<int,_10>::Pop(&this->fFree);
        if ((int)uVar4 < newsize) {
          TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_70,uVar4);
        }
        else if (uVar4 >> 10 == iVar6 - 1U) {
          piVar3 = (this->fNFree).super_TPZVec<int>.fStore + (iVar6 - 1U);
          *piVar3 = *piVar3 + -1;
        }
      } while (0 < (this->fFree).super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements);
    }
    TPZManVector<int,_10>::operator=(&(this->fFree).super_TPZManVector<int,_10>,&local_70);
    TPZManVector<int,_10>::~TPZManVector(&local_70);
  }
  return;
}

Assistant:

void TPZAdmChunkVector<T, EXP>::Resize(const int newsize) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TPZAdmChunkVector::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
#endif

    TPZChunkVector<T, EXP>::Resize(newsize);

    //   int sizechunk = 1 << EXP;
    int nchunks = fNFree.NElements();
    int chunksneeded = this->fVec.NElements(); // equivalent to newsize>>fExponent??

    fNFree.Resize(chunksneeded);

    for (int i = nchunks; i < chunksneeded; i++) {
        fNFree[i] = 0;
    }

    if (chunksneeded > nchunks) return;

    // delete all free indexes which are above the new size
    // update the number of free elements of the last chunk
    TPZStack<int> temp(fFree);
    temp.Resize(0);

    while (fFree.NElements() > 0) {
        int index = fFree.Pop();
        if (index < newsize)
            temp.Push(index);
        else {
            int chunk = index >> EXP;

            if (chunk == chunksneeded - 1)
                fNFree[chunksneeded - 1]--;
        }
    }

    fFree = temp;
}